

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsCallbackFederateNextTimeCallback
               (HelicsFederate fed,_func_HelicsTime_HelicsTime_void_ptr *timeUpdate,void *userdata,
               HelicsError *err)

{
  CallbackFederate *this;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this = getCallbackFed(fed,err);
  if (this != (CallbackFederate *)0x0) {
    if (timeUpdate == (_func_HelicsTime_HelicsTime_void_ptr *)0x0) {
      helics::CallbackFederate::clearNextTimeCallback(this);
      return;
    }
    local_20 = std::
               _Function_handler<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1420:41)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1420:41)>
               ::_M_manager;
    local_38._M_unused._0_8_ = (undefined8)timeUpdate;
    local_38._8_8_ = userdata;
    helics::CallbackFederate::setNextTimeCallback
              (this,(function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
                     *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return;
}

Assistant:

void helicsCallbackFederateNextTimeCallback(HelicsFederate fed,
                                            HelicsTime (*timeUpdate)(HelicsTime time, void* userdata),
                                            void* userdata,
                                            HelicsError* err)
{
    auto* fedptr = getCallbackFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (timeUpdate == nullptr) {
            fedptr->clearNextTimeCallback();
        } else {
            fedptr->setNextTimeCallback([timeUpdate, userdata](helics::Time newTime) { return timeUpdate(newTime, userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}